

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O1

void __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::test::json_parser_def::context::object,_unsigned_long>
::check_default_transition
          (state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::test::json_parser_def::context::object,_unsigned_long>
           *this)

{
  transition_table_type<afsm::none> *ptVar1;
  none local_a;
  indexes_tuple<0UL,_1UL,_2UL> local_9;
  
  ptVar1 = state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::object,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::object,unsigned_long>
           ::transition_table<afsm::none,0ul,1ul,2ul>(&local_9);
  if (ptVar1->_M_elems[this->current_state_].super__Function_base._M_manager != (_Manager_type)0x0)
  {
    (**(code **)(((_Any_data *)(ptVar1->_M_elems + this->current_state_))->_M_pod_data + 0x18))
              ((_Any_data *)(ptVar1->_M_elems + this->current_state_),this,&local_a);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void
    check_default_transition()
    {
        auto const& ttable = transition_table<none>( state_indexes{} );
        ttable[current_state()](*this, none{});
    }